

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

bool hgdb::json::SymbolTable::has_same_var(ScopeBase *scope,VarStmt *stmt)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  undefined1 local_11 [8];
  bool match;
  
  local_38._M_unused._M_object = local_11;
  local_11[0] = 0;
  local_20 = std::
             _Function_handler<bool_(hgdb::json::ScopeBase_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/hgdb/include/json.hh:488:27)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(hgdb::json::ScopeBase_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/hgdb/include/json.hh:488:27)>
             ::_M_manager;
  local_38._8_8_ = stmt;
  walk_up<true>(scope,(function<bool_(hgdb::json::ScopeBase_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (bool)local_11[0];
}

Assistant:

static bool has_same_var(ScopeBase *scope, VarStmt &stmt) {
        bool match = false;
        auto match_func = [&match, &stmt](ScopeBase *s) {
            if (s->type() == "decl" || s->type() == "assign") {
                auto const &ref = *reinterpret_cast<VarStmt *>(s);
                if (stmt == ref) {
                    match = true;
                    return true;
                }
            }
            return false;
        };
        walk_up<true>(scope, match_func);

        return match;
    }